

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O0

void __thiscall FIWadManager::CheckLumpName(FIWadManager *this,char *name)

{
  uint uVar1;
  int iVar2;
  FIWADInfo *pFVar3;
  FString *this_00;
  uint *puVar4;
  uint local_20;
  uint local_1c;
  uint j;
  uint i;
  char *name_local;
  FIWadManager *this_local;
  
  local_1c = 0;
  while( true ) {
    uVar1 = TArray<FIWADInfo,_FIWADInfo>::Size(&this->mIWads);
    if (uVar1 <= local_1c) break;
    local_20 = 0;
    while( true ) {
      pFVar3 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(ulong)local_1c);
      uVar1 = TArray<FString,_FString>::Size(&pFVar3->Lumps);
      if (uVar1 <= local_20) break;
      pFVar3 = TArray<FIWADInfo,_FIWADInfo>::operator[](&this->mIWads,(ulong)local_1c);
      this_00 = TArray<FString,_FString>::operator[](&pFVar3->Lumps,(ulong)local_20);
      iVar2 = FString::CompareNoCase(this_00,name);
      if (iVar2 == 0) {
        puVar4 = (uint *)TArray<int,_int>::operator[](&this->mLumpsFound,(ulong)local_1c);
        *puVar4 = 1 << ((byte)local_20 & 0x1f) | *puVar4;
      }
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void FIWadManager::CheckLumpName(const char *name)
{
	for(unsigned i=0; i< mIWads.Size(); i++)
	{
		for(unsigned j=0; j < mIWads[i].Lumps.Size(); j++)
		{
			if (!mIWads[i].Lumps[j].CompareNoCase(name))
			{
				mLumpsFound[i] |= (1<<j);
			}
		}
	}
}